

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::App::parse_from_stream(App *this,istream *input)

{
  element_type *peVar1;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> local_30;
  
  if (this->parsed_ == 0) {
    _validate(this);
    _configure(this);
  }
  peVar1 = (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_Config[1])(&local_30,peVar1,input);
  _parse_config(this,&local_30);
  increment_parsed(this);
  _trigger_pre_parse(this,((long)local_30.
                                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_30.
                                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4) *
                          -0x3333333333333333);
  _process(this);
  _process_extras(this);
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector(&local_30);
  run_callback(this,false,false);
  return;
}

Assistant:

CLI11_INLINE void App::parse_from_stream(std::istream &input) {
    if(parsed_ == 0) {
        _validate();
        _configure();
        // set the parent as nullptr as this object should be the top now
    }

    _parse_stream(input);
    run_callback();
}